

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void autocorr(double *vec,int N,double *acorr,int M)

{
  double dVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (N < M) {
    uVar3 = (ulong)(N - 1);
    puts(
        "\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1."
        );
    printf("\n The Output Vector only contains N calculated values.");
  }
  else {
    uVar3 = 0;
    if (0 < M) {
      uVar3 = (ulong)(uint)M;
    }
  }
  autocovar(vec,N,acorr,(int)uVar3);
  dVar1 = *acorr;
  *acorr = 1.0;
  if (1 < (int)uVar3) {
    uVar2 = 1;
    do {
      acorr[uVar2] = acorr[uVar2] / dVar1;
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  return;
}

Assistant:

void autocorr(double* vec,int N,double* acorr, int M) {
	double var;
	int i;
	if (M > N) {
		M = N - 1;
		printf("\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1.\n");
		printf("\n The Output Vector only contains N calculated values.");
	}
	else if (M < 0) {
		M = 0;
	}
	autocovar(vec,N,acorr,M);
	var = acorr[0];
	acorr[0] = 1.0;
	
	for(i = 1; i < M; i++) {
		acorr[i] = acorr[i]/var;
	}
	
}